

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::TagVisitor(TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
             *this,cmGeneratorTarget *target,
            vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data)

{
  this->Data = data;
  (this->BadObjLibFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BadObjLibFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BadObjLibFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Target = target;
  this->GlobalGenerator = target->LocalGenerator->GlobalGenerator;
  cmsys::RegularExpression::RegularExpression
            (&this->Header,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  this->IsObjLib = target->Target->TargetTypeValue == OBJECT_LIBRARY;
  return;
}

Assistant:

TagVisitor(cmGeneratorTarget const* target, DataType& data)
    : Data(data), Target(target),
    GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator()),
    Header(CM_HEADER_REGEX),
    IsObjLib(target->GetType() == cmState::OBJECT_LIBRARY)
  {
  }